

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VCVT(DisasContext_conflict1 *s,arg_VCVT *a)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  TCGContext_conflict1 *s_00;
  _Bool _Var6;
  int val;
  TCGTemp *ts;
  TCGv_i32 pTVar7;
  TCGv_i32 pTVar8;
  TCGTemp *pTVar9;
  TCGTemp *pTVar10;
  code *pcVar11;
  TCGTemp *ret;
  long lVar12;
  uintptr_t o;
  TCGv_i64 arg;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_38;
  
  if ((s->isar->mvfr2 & 0xe0) != 0) {
    s_00 = s->uc->tcg_ctx;
    iVar2 = a->dp;
    iVar3 = a->op;
    bVar1 = "\x04"[a->rm];
    if ((iVar2 == 0) ||
       ((uVar4 = s->isar->mvfr0, (uVar4 & 0xf00) != 0 &&
        (((uVar4 & 0xe) != 0 || ((a->vm & 0x10) == 0)))))) {
      uVar4 = a->vd;
      uVar5 = a->vm;
      _Var6 = full_vfp_access_check(s,false);
      if (!_Var6) {
        return true;
      }
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_addi_i64_aarch64
                (s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)s_00->cpu_env,0x2ec8);
      pTVar7 = tcg_const_i32_aarch64(s_00,0);
      val = arm_rmode_to_sf_aarch64((uint)bVar1);
      pTVar8 = tcg_const_i32_aarch64(s_00,val);
      ret = (TCGTemp *)(pTVar8 + (long)s_00);
      local_58 = ret;
      local_50 = ts;
      tcg_gen_callN_aarch64(s_00,helper_set_rmode_aarch64,ret,2,&local_58);
      local_48 = ts;
      if (iVar2 == 0) {
        pTVar9 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
        pTVar10 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
        tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)pTVar9,(TCGArg)(s_00->cpu_env + (long)s_00)
                            ,(ulong)(uVar5 * 4 & 4) +
                             ((ulong)(uVar5 * 4 & 8) | (ulong)(uVar5 >> 2) << 8) + 0xc10);
        local_50 = (TCGTemp *)(pTVar7 + (long)s_00);
        if (iVar3 == 0) {
          pcVar11 = helper_vfp_touls_aarch64;
        }
        else {
          pcVar11 = helper_vfp_tosls_aarch64;
        }
        local_58 = pTVar9;
        tcg_gen_callN_aarch64(s_00,pcVar11,pTVar10,3,&local_58);
        lVar12 = (long)pTVar9 - (long)s_00;
        arg = (TCGv_i64)((long)pTVar10 - (long)s_00);
        tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)pTVar10,
                            (TCGArg)(s_00->cpu_env + (long)s_00),
                            (ulong)(uVar4 * 4 & 4) +
                            ((ulong)(uVar4 * 4 & 8) | (ulong)(uVar4 >> 2) << 8) + 0xc10);
      }
      else {
        pTVar9 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
        pTVar10 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
        arg = (TCGv_i64)((long)pTVar10 - (long)s_00);
        local_38 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
        pTVar8 = (TCGv_i32)((long)local_38 - (long)s_00);
        tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)pTVar9,(TCGArg)(s_00->cpu_env + (long)s_00)
                            ,(ulong)(uVar5 >> 1) * 0x100 + (ulong)(uVar5 & 1) * 8 + 0xc10);
        local_50 = (TCGTemp *)(pTVar7 + (long)s_00);
        if (iVar3 == 0) {
          pcVar11 = helper_vfp_tould_aarch64;
        }
        else {
          pcVar11 = helper_vfp_tosld_aarch64;
        }
        local_58 = pTVar9;
        tcg_gen_callN_aarch64(s_00,pcVar11,pTVar10,3,&local_58);
        lVar12 = (long)pTVar9 - (long)s_00;
        tcg_gen_extrl_i64_i32_aarch64(s_00,pTVar8,arg);
        tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)local_38,
                            (TCGArg)(s_00->cpu_env + (long)s_00),
                            (ulong)(uVar4 << 2 & 4) +
                            ((ulong)(uVar4 << 2 & 8) | (ulong)(uVar4 >> 2) << 8) + 0xc10);
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar8 + (long)s_00));
      }
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(arg + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)((long)&s_00->pool_cur + lVar12));
      local_58 = ret;
      local_50 = ts;
      tcg_gen_callN_aarch64(s_00,helper_set_rmode_aarch64,ret,2,&local_58);
      tcg_temp_free_internal_aarch64(s_00,ret);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar7 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,ts);
      return true;
    }
  }
  return false;
}

Assistant:

static bool trans_VCVT(DisasContext *s, arg_VCVT *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t rd, rm;
    bool dp = a->dp;
    TCGv_ptr fpst;
    TCGv_i32 tcg_rmode, tcg_shift;
    int rounding = fp_decode_rm[a->rm];
    bool is_signed = a->op;

    if (!dc_isar_feature(aa32_vcvt_dr, s)) {
        return false;
    }

    if (dp && !dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (dp && !dc_isar_feature(aa32_simd_r32, s) && (a->vm & 0x10)) {
        return false;
    }

    rd = a->vd;
    rm = a->vm;

    if (!vfp_access_check(s)) {
        return true;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, 0);

    tcg_shift = tcg_const_i32(tcg_ctx, 0);

    tcg_rmode = tcg_const_i32(tcg_ctx, arm_rmode_to_sf(rounding));
    gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, fpst);

    if (dp) {
        TCGv_i64 tcg_double, tcg_res;
        TCGv_i32 tcg_tmp;
        tcg_double = tcg_temp_new_i64(tcg_ctx);
        tcg_res = tcg_temp_new_i64(tcg_ctx);
        tcg_tmp = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg64(tcg_ctx, tcg_double, rm);
        if (is_signed) {
            gen_helper_vfp_tosld(tcg_ctx, tcg_res, tcg_double, tcg_shift, fpst);
        } else {
            gen_helper_vfp_tould(tcg_ctx, tcg_res, tcg_double, tcg_shift, fpst);
        }
        tcg_gen_extrl_i64_i32(tcg_ctx, tcg_tmp, tcg_res);
        neon_store_reg32(tcg_ctx, tcg_tmp, rd);
        tcg_temp_free_i32(tcg_ctx, tcg_tmp);
        tcg_temp_free_i64(tcg_ctx, tcg_res);
        tcg_temp_free_i64(tcg_ctx, tcg_double);
    } else {
        TCGv_i32 tcg_single, tcg_res;
        tcg_single = tcg_temp_new_i32(tcg_ctx);
        tcg_res = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx, tcg_single, rm);
        if (is_signed) {
            gen_helper_vfp_tosls(tcg_ctx, tcg_res, tcg_single, tcg_shift, fpst);
        } else {
            gen_helper_vfp_touls(tcg_ctx, tcg_res, tcg_single, tcg_shift, fpst);
        }
        neon_store_reg32(tcg_ctx, tcg_res, rd);
        tcg_temp_free_i32(tcg_ctx, tcg_res);
        tcg_temp_free_i32(tcg_ctx, tcg_single);
    }

    gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, fpst);
    tcg_temp_free_i32(tcg_ctx, tcg_rmode);

    tcg_temp_free_i32(tcg_ctx, tcg_shift);

    tcg_temp_free_ptr(tcg_ctx, fpst);

    return true;
}